

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall
fasttext::FastText::getWordVector(FastText *this,Vector *vec,string *word,int factor,float addWo)

{
  int32_t iVar1;
  Vector *this_00;
  Vector *pVVar2;
  size_type sVar3;
  int in_ECX;
  Dictionary *in_RSI;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  int id;
  int i_1;
  int i;
  vector<int,_std::allocator<int>_> *ngrams;
  undefined4 in_stack_ffffffffffffff70;
  int32_t in_stack_ffffffffffffff74;
  Dictionary *in_stack_ffffffffffffff78;
  real a;
  Dictionary *in_stack_ffffffffffffff80;
  Dictionary *in_stack_ffffffffffffff88;
  int local_54;
  int local_50;
  string *in_stack_ffffffffffffffd0;
  Dictionary *in_stack_ffffffffffffffd8;
  vector<int,_std::allocator<int>_> *this_01;
  
  fVar4 = in_ZMM0._0_4_;
  std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1a96ef);
  this_01 = (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffc0;
  Dictionary::getSubwords(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  Vector::zero((Vector *)in_stack_ffffffffffffff80);
  local_50 = 0;
  while( true ) {
    this_00 = (Vector *)(long)local_50;
    pVVar2 = (Vector *)std::vector<int,_std::allocator<int>_>::size(this_01);
    if (pVVar2 <= this_00) break;
    in_stack_ffffffffffffff88 = in_RSI;
    std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)local_50);
    addInputVector((FastText *)in_stack_ffffffffffffff80,(Vector *)in_stack_ffffffffffffff78,
                   in_stack_ffffffffffffff74);
    local_50 = local_50 + 1;
  }
  for (local_54 = 0; auVar5 = in_ZMM0._0_16_, local_54 < in_ECX; local_54 = local_54 + 1) {
    in_stack_ffffffffffffff80 = in_RSI;
    std::vector<int,_std::allocator<int>_>::operator[](this_01,0);
    addInputVector((FastText *)in_stack_ffffffffffffff80,(Vector *)in_stack_ffffffffffffff78,
                   in_stack_ffffffffffffff74);
  }
  sVar3 = std::vector<int,_std::allocator<int>_>::size(this_01);
  if (sVar3 != 0) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size(this_01);
    vcvtusi2sd_avx512f(auVar5,sVar3 + (long)in_ECX);
    Vector::mul(this_00,(real)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    in_stack_ffffffffffffff78 = in_RSI;
  }
  if (0.0 < fVar4) {
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1a9866);
    iVar1 = Dictionary::getId(in_stack_ffffffffffffff80,(string *)in_stack_ffffffffffffff78);
    a = (real)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(iVar1,in_stack_ffffffffffffff70));
    Vector::addRow(this_00,(Matrix *)in_stack_ffffffffffffff88,(int64_t)in_stack_ffffffffffffff80,a)
    ;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80);
  return;
}

Assistant:

void FastText::getWordVector(Vector& vec, const std::string& word, int factor, float addWo) const {
  const std::vector<int32_t>& ngrams = dict_->getSubwords(word);
  vec.zero();
  for (int i = 0; i < ngrams.size(); i++) {
    addInputVector(vec, ngrams[i]);
  }
  for (int i = 0; i < factor; i++) {
    addInputVector(vec,ngrams[0]);//控制subwords中word emb和subword/char emb的加权
  }
  if (ngrams.size() > 0) {
    vec.mul(1.0 / (ngrams.size()+factor));
  }
  if (addWo > 0) {
    const int id = dict_->getId(word);
    vec.addRow(*output_, id, addWo);
  }
}